

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 uVar11;
  float fVar12;
  Scene *pSVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ulong uVar19;
  byte bVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  ulong *local_c20;
  undefined1 local_b90 [16];
  long local_b80;
  ulong local_b78;
  long local_b70;
  ulong local_b68;
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  RTCFilterFunctionNArguments local_b00;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [32];
  RTCHitN local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  char local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar70 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar71 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar72 = ZEXT1664(auVar34);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar73 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar8 * 0.99999964)));
  auVar74 = ZEXT1664(auVar34);
  auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar9 * 0.99999964)));
  auVar75 = ZEXT1664(auVar34);
  fVar7 = fVar7 * 1.0000004;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_b68 = uVar30 ^ 0x10;
  iVar10 = (tray->tnear).field_0.i[k];
  auVar34._4_4_ = iVar10;
  auVar34._0_4_ = iVar10;
  auVar34._8_4_ = iVar10;
  auVar34._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar68._4_4_ = iVar10;
  auVar68._0_4_ = iVar10;
  auVar68._8_4_ = iVar10;
  auVar68._12_4_ = iVar10;
  local_ad0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_c20 = local_7f8;
LAB_01cd3352:
  do {
    puVar29 = local_c20;
    if (puVar29 == &local_800) {
LAB_01cd3ce0:
      return puVar29 != &local_800;
    }
    local_c20 = puVar29 + -1;
    uVar33 = puVar29[-1];
    while ((uVar33 & 8) == 0) {
      auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + uVar30),auVar70._0_16_);
      auVar35 = vmulps_avx512vl(auVar73._0_16_,auVar35);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + uVar32),auVar71._0_16_);
      auVar36 = vmulps_avx512vl(auVar74._0_16_,auVar36);
      auVar35 = vmaxps_avx(auVar35,auVar36);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + uVar31),auVar72._0_16_);
      auVar36 = vmulps_avx512vl(auVar75._0_16_,auVar36);
      auVar36 = vmaxps_avx(auVar36,auVar34);
      auVar35 = vmaxps_avx(auVar35,auVar36);
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + local_b68),auVar70._0_16_);
      auVar37._0_4_ = fVar7 * auVar36._0_4_;
      auVar37._4_4_ = fVar7 * auVar36._4_4_;
      auVar37._8_4_ = fVar7 * auVar36._8_4_;
      auVar37._12_4_ = fVar7 * auVar36._12_4_;
      auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + (uVar32 ^ 0x10)),
                                auVar71._0_16_);
      auVar60._0_4_ = fVar8 * auVar36._0_4_;
      auVar60._4_4_ = fVar8 * auVar36._4_4_;
      auVar60._8_4_ = fVar8 * auVar36._8_4_;
      auVar60._12_4_ = fVar8 * auVar36._12_4_;
      auVar36 = vminps_avx(auVar37,auVar60);
      auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar33 + 0x20 + (uVar31 ^ 0x10)),
                                auVar72._0_16_);
      auVar61._0_4_ = fVar9 * auVar37._0_4_;
      auVar61._4_4_ = fVar9 * auVar37._4_4_;
      auVar61._8_4_ = fVar9 * auVar37._8_4_;
      auVar61._12_4_ = fVar9 * auVar37._12_4_;
      auVar37 = vminps_avx(auVar61,auVar68);
      auVar36 = vminps_avx(auVar36,auVar37);
      uVar28 = vcmpps_avx512vl(auVar35,auVar36,2);
      if ((char)uVar28 == '\0') goto LAB_01cd3352;
      uVar25 = uVar33 & 0xfffffffffffffff0;
      lVar21 = 0;
      for (uVar33 = uVar28; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar33 = *(ulong *)(uVar25 + lVar21 * 8);
      uVar27 = (uint)uVar28 - 1 & (uint)uVar28;
      uVar28 = (ulong)uVar27;
      if (uVar27 != 0) {
        do {
          *local_c20 = uVar33;
          local_c20 = local_c20 + 1;
          lVar21 = 0;
          for (uVar33 = uVar28; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar28 = uVar28 - 1 & uVar28;
          uVar33 = *(ulong *)(uVar25 + lVar21 * 8);
        } while (uVar28 != 0);
      }
    }
    local_b70 = (ulong)((uint)uVar33 & 0xf) - 8;
    uVar33 = uVar33 & 0xfffffffffffffff0;
    for (local_b80 = 0; local_b80 != local_b70; local_b80 = local_b80 + 1) {
      lVar26 = local_b80 * 0xe0;
      lVar21 = uVar33 + 0xd0 + lVar26;
      local_a00 = *(undefined8 *)(lVar21 + 0x10);
      uStack_9f8 = *(undefined8 *)(lVar21 + 0x18);
      lVar21 = uVar33 + 0xc0 + lVar26;
      local_9e0 = *(undefined8 *)(lVar21 + 0x10);
      uStack_9d8 = *(undefined8 *)(lVar21 + 0x18);
      uStack_9d0 = local_9e0;
      uStack_9c8 = uStack_9d8;
      uStack_9f0 = local_a00;
      uStack_9e8 = uStack_9f8;
      auVar59._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x60 + lVar26);
      auVar59._0_16_ = *(undefined1 (*) [16])(uVar33 + lVar26);
      auVar40._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x70 + lVar26);
      auVar40._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x10 + lVar26);
      auVar41._16_16_ = *(undefined1 (*) [16])(uVar33 + 0x80 + lVar26);
      auVar41._0_16_ = *(undefined1 (*) [16])(uVar33 + 0x20 + lVar26);
      auVar35 = *(undefined1 (*) [16])(uVar33 + 0x30 + lVar26);
      auVar45._16_16_ = auVar35;
      auVar45._0_16_ = auVar35;
      auVar35 = *(undefined1 (*) [16])(uVar33 + 0x40 + lVar26);
      auVar46._16_16_ = auVar35;
      auVar46._0_16_ = auVar35;
      auVar35 = *(undefined1 (*) [16])(uVar33 + 0x50 + lVar26);
      auVar47._16_16_ = auVar35;
      auVar47._0_16_ = auVar35;
      auVar35 = *(undefined1 (*) [16])(uVar33 + 0x90 + lVar26);
      auVar48._16_16_ = auVar35;
      auVar48._0_16_ = auVar35;
      auVar35 = *(undefined1 (*) [16])(uVar33 + 0xa0 + lVar26);
      auVar49._16_16_ = auVar35;
      auVar49._0_16_ = auVar35;
      auVar35 = *(undefined1 (*) [16])(uVar33 + 0xb0 + lVar26);
      auVar50._16_16_ = auVar35;
      auVar50._0_16_ = auVar35;
      uVar11 = *(undefined4 *)(ray + k * 4);
      auVar51._4_4_ = uVar11;
      auVar51._0_4_ = uVar11;
      auVar51._8_4_ = uVar11;
      auVar51._12_4_ = uVar11;
      auVar51._16_4_ = uVar11;
      auVar51._20_4_ = uVar11;
      auVar51._24_4_ = uVar11;
      auVar51._28_4_ = uVar11;
      auVar38 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
      auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar64._4_4_ = uVar11;
      auVar64._0_4_ = uVar11;
      auVar64._8_4_ = uVar11;
      auVar64._12_4_ = uVar11;
      auVar64._16_4_ = uVar11;
      auVar64._20_4_ = uVar11;
      auVar64._24_4_ = uVar11;
      auVar64._28_4_ = uVar11;
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar66._4_4_ = uVar11;
      auVar66._0_4_ = uVar11;
      auVar66._8_4_ = uVar11;
      auVar66._12_4_ = uVar11;
      auVar66._16_4_ = uVar11;
      auVar66._20_4_ = uVar11;
      auVar66._24_4_ = uVar11;
      auVar66._28_4_ = uVar11;
      fVar12 = *(float *)(ray + k * 4 + 0x60);
      auVar67._4_4_ = fVar12;
      auVar67._0_4_ = fVar12;
      auVar67._8_4_ = fVar12;
      auVar67._12_4_ = fVar12;
      auVar67._16_4_ = fVar12;
      auVar67._20_4_ = fVar12;
      auVar67._24_4_ = fVar12;
      auVar67._28_4_ = fVar12;
      auVar59 = vsubps_avx(auVar59,auVar51);
      auVar40 = vsubps_avx512vl(auVar40,auVar38);
      auVar41 = vsubps_avx512vl(auVar41,auVar39);
      auVar42 = vsubps_avx512vl(auVar45,auVar51);
      auVar43 = vsubps_avx512vl(auVar46,auVar38);
      auVar44 = vsubps_avx512vl(auVar47,auVar39);
      auVar58 = vsubps_avx(auVar48,auVar51);
      auVar45 = vsubps_avx512vl(auVar49,auVar38);
      auVar46 = vsubps_avx512vl(auVar50,auVar39);
      auVar38 = vsubps_avx(auVar58,auVar59);
      auVar47 = vsubps_avx512vl(auVar45,auVar40);
      auVar39 = vsubps_avx(auVar46,auVar41);
      auVar48 = vsubps_avx512vl(auVar59,auVar42);
      auVar49 = vsubps_avx512vl(auVar40,auVar43);
      auVar50 = vsubps_avx512vl(auVar41,auVar44);
      auVar51 = vsubps_avx512vl(auVar42,auVar58);
      auVar52 = vsubps_avx512vl(auVar43,auVar45);
      auVar53 = vsubps_avx512vl(auVar44,auVar46);
      auVar62._0_4_ = auVar58._0_4_ + auVar59._0_4_;
      auVar62._4_4_ = auVar58._4_4_ + auVar59._4_4_;
      auVar62._8_4_ = auVar58._8_4_ + auVar59._8_4_;
      auVar62._12_4_ = auVar58._12_4_ + auVar59._12_4_;
      auVar62._16_4_ = auVar58._16_4_ + auVar59._16_4_;
      auVar62._20_4_ = auVar58._20_4_ + auVar59._20_4_;
      auVar62._24_4_ = auVar58._24_4_ + auVar59._24_4_;
      auVar62._28_4_ = auVar58._28_4_ + auVar59._28_4_;
      auVar54 = vaddps_avx512vl(auVar45,auVar40);
      auVar55 = vaddps_avx512vl(auVar46,auVar41);
      auVar56 = vmulps_avx512vl(auVar54,auVar39);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar47,auVar55);
      auVar55 = vmulps_avx512vl(auVar55,auVar38);
      auVar57 = vfmsub231ps_avx512vl(auVar55,auVar39,auVar62);
      auVar55._4_4_ = auVar47._4_4_ * auVar62._4_4_;
      auVar55._0_4_ = auVar47._0_4_ * auVar62._0_4_;
      auVar55._8_4_ = auVar47._8_4_ * auVar62._8_4_;
      auVar55._12_4_ = auVar47._12_4_ * auVar62._12_4_;
      auVar55._16_4_ = auVar47._16_4_ * auVar62._16_4_;
      auVar55._20_4_ = auVar47._20_4_ * auVar62._20_4_;
      auVar55._24_4_ = auVar47._24_4_ * auVar62._24_4_;
      auVar55._28_4_ = auVar62._28_4_;
      auVar35 = vfmsub231ps_fma(auVar55,auVar38,auVar54);
      auVar63._0_4_ = fVar12 * auVar35._0_4_;
      auVar63._4_4_ = fVar12 * auVar35._4_4_;
      auVar63._8_4_ = fVar12 * auVar35._8_4_;
      auVar63._12_4_ = fVar12 * auVar35._12_4_;
      auVar63._16_4_ = fVar12 * 0.0;
      auVar63._20_4_ = fVar12 * 0.0;
      auVar63._24_4_ = fVar12 * 0.0;
      auVar63._28_4_ = 0;
      auVar55 = vfmadd231ps_avx512vl(auVar63,auVar66,auVar57);
      local_9c0 = vfmadd231ps_avx512vl(auVar55,auVar64,auVar56);
      auVar55 = vaddps_avx512vl(auVar59,auVar42);
      auVar54 = vaddps_avx512vl(auVar40,auVar43);
      auVar56 = vaddps_avx512vl(auVar41,auVar44);
      auVar57 = vmulps_avx512vl(auVar54,auVar50);
      auVar57 = vfmsub231ps_avx512vl(auVar57,auVar49,auVar56);
      auVar56 = vmulps_avx512vl(auVar56,auVar48);
      auVar56 = vfmsub231ps_avx512vl(auVar56,auVar50,auVar55);
      auVar55 = vmulps_avx512vl(auVar55,auVar49);
      auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar54);
      auVar54._4_4_ = fVar12 * auVar55._4_4_;
      auVar54._0_4_ = fVar12 * auVar55._0_4_;
      auVar54._8_4_ = fVar12 * auVar55._8_4_;
      auVar54._12_4_ = fVar12 * auVar55._12_4_;
      auVar54._16_4_ = fVar12 * auVar55._16_4_;
      auVar54._20_4_ = fVar12 * auVar55._20_4_;
      auVar54._24_4_ = fVar12 * auVar55._24_4_;
      auVar54._28_4_ = auVar55._28_4_;
      auVar55 = vfmadd231ps_avx512vl(auVar54,auVar66,auVar56);
      local_9a0 = vfmadd231ps_avx512vl(auVar55,auVar64,auVar57);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar58 = vaddps_avx512vl(auVar42,auVar58);
      auVar42 = vaddps_avx512vl(auVar43,auVar45);
      auVar54 = vaddps_avx512vl(auVar44,auVar46);
      auVar43 = vmulps_avx512vl(auVar42,auVar53);
      auVar45 = vfmsub231ps_avx512vl(auVar43,auVar52,auVar54);
      auVar43._4_4_ = auVar54._4_4_ * auVar51._4_4_;
      auVar43._0_4_ = auVar54._0_4_ * auVar51._0_4_;
      auVar43._8_4_ = auVar54._8_4_ * auVar51._8_4_;
      auVar43._12_4_ = auVar54._12_4_ * auVar51._12_4_;
      auVar43._16_4_ = auVar54._16_4_ * auVar51._16_4_;
      auVar43._20_4_ = auVar54._20_4_ * auVar51._20_4_;
      auVar43._24_4_ = auVar54._24_4_ * auVar51._24_4_;
      auVar43._28_4_ = auVar54._28_4_;
      auVar35 = vfmsub231ps_fma(auVar43,auVar53,auVar58);
      auVar44._4_4_ = auVar58._4_4_ * auVar52._4_4_;
      auVar44._0_4_ = auVar58._0_4_ * auVar52._0_4_;
      auVar44._8_4_ = auVar58._8_4_ * auVar52._8_4_;
      auVar44._12_4_ = auVar58._12_4_ * auVar52._12_4_;
      auVar44._16_4_ = auVar58._16_4_ * auVar52._16_4_;
      auVar44._20_4_ = auVar58._20_4_ * auVar52._20_4_;
      auVar44._24_4_ = auVar58._24_4_ * auVar52._24_4_;
      auVar44._28_4_ = auVar58._28_4_;
      auVar58 = vfmsub231ps_avx512vl(auVar44,auVar51,auVar42);
      auVar58 = vmulps_avx512vl(auVar58,auVar67);
      auVar58 = vfmadd231ps_avx512vl(auVar58,auVar66,ZEXT1632(auVar35));
      auVar54 = vfmadd231ps_avx512vl(auVar58,auVar64,auVar45);
      auVar56._0_4_ = local_9c0._0_4_ + local_9a0._0_4_;
      auVar56._4_4_ = local_9c0._4_4_ + local_9a0._4_4_;
      auVar56._8_4_ = local_9c0._8_4_ + local_9a0._8_4_;
      auVar56._12_4_ = local_9c0._12_4_ + local_9a0._12_4_;
      auVar56._16_4_ = local_9c0._16_4_ + local_9a0._16_4_;
      auVar56._20_4_ = local_9c0._20_4_ + local_9a0._20_4_;
      auVar56._24_4_ = local_9c0._24_4_ + local_9a0._24_4_;
      auVar56._28_4_ = local_9c0._28_4_ + local_9a0._28_4_;
      local_980 = vaddps_avx512vl(auVar54,auVar56);
      vandps_avx512vl(local_980,auVar55);
      auVar58._8_4_ = 0x34000000;
      auVar58._0_8_ = 0x3400000034000000;
      auVar58._12_4_ = 0x34000000;
      auVar58._16_4_ = 0x34000000;
      auVar58._20_4_ = 0x34000000;
      auVar58._24_4_ = 0x34000000;
      auVar58._28_4_ = 0x34000000;
      auVar58 = vmulps_avx512vl(local_980,auVar58);
      auVar42 = vminps_avx512vl(local_9c0,local_9a0);
      auVar43 = vminps_avx512vl(auVar42,auVar54);
      auVar42._8_4_ = 0x80000000;
      auVar42._0_8_ = 0x8000000080000000;
      auVar42._12_4_ = 0x80000000;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar42 = vxorps_avx512vl(auVar58,auVar42);
      uVar17 = vcmpps_avx512vl(auVar43,auVar42,5);
      auVar42 = vmaxps_avx512vl(local_9c0,local_9a0);
      auVar42 = vmaxps_avx512vl(auVar42,auVar54);
      uVar18 = vcmpps_avx512vl(auVar42,auVar58,2);
      bVar20 = (byte)uVar17 | (byte)uVar18;
      if (bVar20 != 0) {
        auVar58 = vmulps_avx512vl(auVar49,auVar39);
        auVar42 = vmulps_avx512vl(auVar38,auVar50);
        auVar54 = vmulps_avx512vl(auVar48,auVar47);
        auVar43 = vmulps_avx512vl(auVar52,auVar50);
        auVar44 = vmulps_avx512vl(auVar48,auVar53);
        auVar45 = vmulps_avx512vl(auVar51,auVar49);
        auVar46 = vfmsub213ps_avx512vl(auVar47,auVar50,auVar58);
        auVar39 = vfmsub213ps_avx512vl(auVar39,auVar48,auVar42);
        auVar38 = vfmsub213ps_avx512vl(auVar38,auVar49,auVar54);
        auVar47 = vfmsub213ps_avx512vl(auVar53,auVar49,auVar43);
        auVar49 = vfmsub213ps_avx512vl(auVar51,auVar50,auVar44);
        auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar45);
        vandps_avx512vl(auVar58,auVar55);
        vandps_avx512vl(auVar43,auVar55);
        uVar28 = vcmpps_avx512vl(auVar48,auVar48,1);
        vandps_avx512vl(auVar42,auVar55);
        vandps_avx512vl(auVar44,auVar55);
        uVar25 = vcmpps_avx512vl(auVar48,auVar48,1);
        vandps_avx512vl(auVar54,auVar55);
        vandps_avx512vl(auVar45,auVar55);
        uVar19 = vcmpps_avx512vl(auVar48,auVar48,1);
        bVar16 = (bool)((byte)uVar28 & 1);
        local_960._0_4_ = (float)((uint)bVar16 * auVar46._0_4_ | (uint)!bVar16 * auVar47._0_4_);
        bVar16 = (bool)((byte)(uVar28 >> 1) & 1);
        local_960._4_4_ = (float)((uint)bVar16 * auVar46._4_4_ | (uint)!bVar16 * auVar47._4_4_);
        bVar16 = (bool)((byte)(uVar28 >> 2) & 1);
        local_960._8_4_ = (float)((uint)bVar16 * auVar46._8_4_ | (uint)!bVar16 * auVar47._8_4_);
        bVar16 = (bool)((byte)(uVar28 >> 3) & 1);
        local_960._12_4_ = (float)((uint)bVar16 * auVar46._12_4_ | (uint)!bVar16 * auVar47._12_4_);
        bVar16 = (bool)((byte)(uVar28 >> 4) & 1);
        local_960._16_4_ = (float)((uint)bVar16 * auVar46._16_4_ | (uint)!bVar16 * auVar47._16_4_);
        bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
        local_960._20_4_ = (float)((uint)bVar16 * auVar46._20_4_ | (uint)!bVar16 * auVar47._20_4_);
        bVar16 = (bool)((byte)(uVar28 >> 6) & 1);
        local_960._24_4_ = (float)((uint)bVar16 * auVar46._24_4_ | (uint)!bVar16 * auVar47._24_4_);
        bVar16 = SUB81(uVar28 >> 7,0);
        local_960._28_4_ = (uint)bVar16 * auVar46._28_4_ | (uint)!bVar16 * auVar47._28_4_;
        bVar16 = (bool)((byte)uVar25 & 1);
        local_940._0_4_ = (float)((uint)bVar16 * auVar39._0_4_ | (uint)!bVar16 * auVar49._0_4_);
        bVar16 = (bool)((byte)(uVar25 >> 1) & 1);
        local_940._4_4_ = (float)((uint)bVar16 * auVar39._4_4_ | (uint)!bVar16 * auVar49._4_4_);
        bVar16 = (bool)((byte)(uVar25 >> 2) & 1);
        local_940._8_4_ = (float)((uint)bVar16 * auVar39._8_4_ | (uint)!bVar16 * auVar49._8_4_);
        bVar16 = (bool)((byte)(uVar25 >> 3) & 1);
        local_940._12_4_ = (float)((uint)bVar16 * auVar39._12_4_ | (uint)!bVar16 * auVar49._12_4_);
        bVar16 = (bool)((byte)(uVar25 >> 4) & 1);
        local_940._16_4_ = (float)((uint)bVar16 * auVar39._16_4_ | (uint)!bVar16 * auVar49._16_4_);
        bVar16 = (bool)((byte)(uVar25 >> 5) & 1);
        local_940._20_4_ = (float)((uint)bVar16 * auVar39._20_4_ | (uint)!bVar16 * auVar49._20_4_);
        bVar16 = (bool)((byte)(uVar25 >> 6) & 1);
        local_940._24_4_ = (float)((uint)bVar16 * auVar39._24_4_ | (uint)!bVar16 * auVar49._24_4_);
        bVar16 = SUB81(uVar25 >> 7,0);
        local_940._28_4_ = (uint)bVar16 * auVar39._28_4_ | (uint)!bVar16 * auVar49._28_4_;
        bVar16 = (bool)((byte)uVar19 & 1);
        local_920._0_4_ = (float)((uint)bVar16 * auVar38._0_4_ | (uint)!bVar16 * auVar48._0_4_);
        bVar16 = (bool)((byte)(uVar19 >> 1) & 1);
        local_920._4_4_ = (float)((uint)bVar16 * auVar38._4_4_ | (uint)!bVar16 * auVar48._4_4_);
        bVar16 = (bool)((byte)(uVar19 >> 2) & 1);
        local_920._8_4_ = (float)((uint)bVar16 * auVar38._8_4_ | (uint)!bVar16 * auVar48._8_4_);
        bVar16 = (bool)((byte)(uVar19 >> 3) & 1);
        local_920._12_4_ = (float)((uint)bVar16 * auVar38._12_4_ | (uint)!bVar16 * auVar48._12_4_);
        bVar16 = (bool)((byte)(uVar19 >> 4) & 1);
        local_920._16_4_ = (float)((uint)bVar16 * auVar38._16_4_ | (uint)!bVar16 * auVar48._16_4_);
        bVar16 = (bool)((byte)(uVar19 >> 5) & 1);
        local_920._20_4_ = (float)((uint)bVar16 * auVar38._20_4_ | (uint)!bVar16 * auVar48._20_4_);
        bVar16 = (bool)((byte)(uVar19 >> 6) & 1);
        local_920._24_4_ = (float)((uint)bVar16 * auVar38._24_4_ | (uint)!bVar16 * auVar48._24_4_);
        bVar16 = SUB81(uVar19 >> 7,0);
        local_920._28_4_ = (uint)bVar16 * auVar38._28_4_ | (uint)!bVar16 * auVar48._28_4_;
        auVar52._4_4_ = fVar12 * local_920._4_4_;
        auVar52._0_4_ = fVar12 * local_920._0_4_;
        auVar52._8_4_ = fVar12 * local_920._8_4_;
        auVar52._12_4_ = fVar12 * local_920._12_4_;
        auVar52._16_4_ = fVar12 * local_920._16_4_;
        auVar52._20_4_ = fVar12 * local_920._20_4_;
        auVar52._24_4_ = fVar12 * local_920._24_4_;
        auVar52._28_4_ = fVar12;
        auVar35 = vfmadd213ps_fma(auVar66,local_940,auVar52);
        auVar35 = vfmadd213ps_fma(auVar64,local_960,ZEXT1632(auVar35));
        auVar42 = ZEXT1632(CONCAT412(auVar35._12_4_ + auVar35._12_4_,
                                     CONCAT48(auVar35._8_4_ + auVar35._8_4_,
                                              CONCAT44(auVar35._4_4_ + auVar35._4_4_,
                                                       auVar35._0_4_ + auVar35._0_4_))));
        auVar53._0_4_ = auVar41._0_4_ * local_920._0_4_;
        auVar53._4_4_ = auVar41._4_4_ * local_920._4_4_;
        auVar53._8_4_ = auVar41._8_4_ * local_920._8_4_;
        auVar53._12_4_ = auVar41._12_4_ * local_920._12_4_;
        auVar53._16_4_ = auVar41._16_4_ * local_920._16_4_;
        auVar53._20_4_ = auVar41._20_4_ * local_920._20_4_;
        auVar53._24_4_ = auVar41._24_4_ * local_920._24_4_;
        auVar53._28_4_ = 0;
        auVar35 = vfmadd213ps_fma(auVar40,local_940,auVar53);
        auVar36 = vfmadd213ps_fma(auVar59,local_960,ZEXT1632(auVar35));
        auVar59 = vrcp14ps_avx512vl(auVar42);
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        auVar38._16_4_ = 0x3f800000;
        auVar38._20_4_ = 0x3f800000;
        auVar38._24_4_ = 0x3f800000;
        auVar38._28_4_ = 0x3f800000;
        auVar58 = vfnmadd213ps_avx512vl(auVar59,auVar42,auVar38);
        auVar35 = vfmadd132ps_fma(auVar58,auVar59,auVar59);
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar57._4_4_ = uVar11;
        auVar57._0_4_ = uVar11;
        auVar57._8_4_ = uVar11;
        auVar57._12_4_ = uVar11;
        auVar57._16_4_ = uVar11;
        auVar57._20_4_ = uVar11;
        auVar57._24_4_ = uVar11;
        auVar57._28_4_ = uVar11;
        auVar69 = ZEXT3264(auVar57);
        local_8a0 = ZEXT1632(CONCAT412(auVar35._12_4_ * (auVar36._12_4_ + auVar36._12_4_),
                                       CONCAT48(auVar35._8_4_ * (auVar36._8_4_ + auVar36._8_4_),
                                                CONCAT44(auVar35._4_4_ *
                                                         (auVar36._4_4_ + auVar36._4_4_),
                                                         auVar35._0_4_ *
                                                         (auVar36._0_4_ + auVar36._0_4_)))));
        uVar17 = vcmpps_avx512vl(local_8a0,auVar57,2);
        uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar39._4_4_ = uVar11;
        auVar39._0_4_ = uVar11;
        auVar39._8_4_ = uVar11;
        auVar39._12_4_ = uVar11;
        auVar39._16_4_ = uVar11;
        auVar39._20_4_ = uVar11;
        auVar39._24_4_ = uVar11;
        auVar39._28_4_ = uVar11;
        uVar18 = vcmpps_avx512vl(local_8a0,auVar39,0xd);
        bVar20 = (byte)uVar17 & (byte)uVar18 & bVar20;
        if (bVar20 != 0) {
          local_b78 = vcmpps_avx512vl(auVar42,_DAT_01f7b000,4);
          local_b78 = bVar20 & local_b78;
          if ((char)local_b78 != '\0') {
            local_900 = (char)local_b78;
            local_820 = 0xf0;
            pSVar13 = context->scene;
            auVar22._8_4_ = 0x219392ef;
            auVar22._0_8_ = 0x219392ef219392ef;
            auVar22._12_4_ = 0x219392ef;
            auVar22._16_4_ = 0x219392ef;
            auVar22._20_4_ = 0x219392ef;
            auVar22._24_4_ = 0x219392ef;
            auVar22._28_4_ = 0x219392ef;
            uVar28 = vcmpps_avx512vl(local_980,auVar22,5);
            auVar58 = vrcp14ps_avx512vl(local_980);
            auVar65._8_4_ = 0x3f800000;
            auVar65._0_8_ = 0x3f8000003f800000;
            auVar65._12_4_ = 0x3f800000;
            auVar65._16_4_ = 0x3f800000;
            auVar65._20_4_ = 0x3f800000;
            auVar65._24_4_ = 0x3f800000;
            auVar65._28_4_ = 0x3f800000;
            auVar35 = vfnmadd213ps_fma(local_980,auVar58,auVar65);
            auVar59 = vfmadd132ps_avx512vl(ZEXT1632(auVar35),auVar58,auVar58);
            fVar1 = (float)((uint)((byte)uVar28 & 1) * auVar59._0_4_);
            fVar12 = (float)((uint)((byte)(uVar28 >> 1) & 1) * auVar59._4_4_);
            fVar2 = (float)((uint)((byte)(uVar28 >> 2) & 1) * auVar59._8_4_);
            fVar3 = (float)((uint)((byte)(uVar28 >> 3) & 1) * auVar59._12_4_);
            fVar4 = (float)((uint)((byte)(uVar28 >> 4) & 1) * auVar59._16_4_);
            fVar5 = (float)((uint)((byte)(uVar28 >> 5) & 1) * auVar59._20_4_);
            fVar6 = (float)((uint)((byte)(uVar28 >> 6) & 1) * auVar59._24_4_);
            auVar23._4_4_ = fVar12 * local_9c0._4_4_;
            auVar23._0_4_ = fVar1 * local_9c0._0_4_;
            auVar23._8_4_ = fVar2 * local_9c0._8_4_;
            auVar23._12_4_ = fVar3 * local_9c0._12_4_;
            auVar23._16_4_ = fVar4 * local_9c0._16_4_;
            auVar23._20_4_ = fVar5 * local_9c0._20_4_;
            auVar23._24_4_ = fVar6 * local_9c0._24_4_;
            auVar23._28_4_ = local_9c0._28_4_;
            auVar59 = vminps_avx(auVar23,auVar65);
            auVar24._4_4_ = fVar12 * local_9a0._4_4_;
            auVar24._0_4_ = fVar1 * local_9a0._0_4_;
            auVar24._8_4_ = fVar2 * local_9a0._8_4_;
            auVar24._12_4_ = fVar3 * local_9a0._12_4_;
            auVar24._16_4_ = fVar4 * local_9a0._16_4_;
            auVar24._20_4_ = fVar5 * local_9a0._20_4_;
            auVar24._24_4_ = fVar6 * local_9a0._24_4_;
            auVar24._28_4_ = auVar58._28_4_;
            auVar58 = vminps_avx(auVar24,auVar65);
            auVar38 = vsubps_avx(auVar65,auVar59);
            auVar39 = vsubps_avx(auVar65,auVar58);
            local_8c0 = vblendps_avx(auVar58,auVar38,0xf0);
            local_8e0 = vblendps_avx(auVar59,auVar39,0xf0);
            fVar12 = (float)DAT_01fbac00;
            fVar6 = DAT_01fbac00._4_4_;
            local_880._4_4_ = local_960._4_4_ * fVar6;
            local_880._0_4_ = local_960._0_4_ * fVar12;
            fVar5 = DAT_01fbac00._8_4_;
            local_880._8_4_ = local_960._8_4_ * fVar5;
            fVar4 = DAT_01fbac00._12_4_;
            local_880._12_4_ = local_960._12_4_ * fVar4;
            fVar3 = DAT_01fbac00._16_4_;
            local_880._16_4_ = local_960._16_4_ * fVar3;
            fVar2 = DAT_01fbac00._20_4_;
            local_880._20_4_ = local_960._20_4_ * fVar2;
            fVar1 = DAT_01fbac00._24_4_;
            local_880._24_4_ = local_960._24_4_ * fVar1;
            local_880._28_4_ = local_960._28_4_;
            local_860._4_4_ = local_940._4_4_ * fVar6;
            local_860._0_4_ = local_940._0_4_ * fVar12;
            local_860._8_4_ = local_940._8_4_ * fVar5;
            local_860._12_4_ = local_940._12_4_ * fVar4;
            local_860._16_4_ = local_940._16_4_ * fVar3;
            local_860._20_4_ = local_940._20_4_ * fVar2;
            local_860._24_4_ = local_940._24_4_ * fVar1;
            local_860._28_4_ = local_940._28_4_;
            local_840._4_4_ = local_920._4_4_ * fVar6;
            local_840._0_4_ = local_920._0_4_ * fVar12;
            local_840._8_4_ = local_920._8_4_ * fVar5;
            local_840._12_4_ = local_920._12_4_ * fVar4;
            local_840._16_4_ = local_920._16_4_ * fVar3;
            local_840._20_4_ = local_920._20_4_ * fVar2;
            local_840._24_4_ = local_920._24_4_ * fVar1;
            local_840._28_4_ = local_920._28_4_;
            do {
              local_b10 = auVar70._0_16_;
              local_b20 = auVar71._0_16_;
              local_b30 = auVar72._0_16_;
              local_b40 = auVar73._0_16_;
              local_b50 = auVar74._0_16_;
              local_b60 = auVar75._0_16_;
              uVar28 = 0;
              for (uVar25 = local_b78; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000)
              {
                uVar28 = uVar28 + 1;
              }
              pGVar14 = (pSVar13->geometries).items[*(uint *)((long)&local_9e0 + uVar28 * 4)].ptr;
              if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                local_b78 = local_b78 ^ 1L << (uVar28 & 0x3f);
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01cd3ccc:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  goto LAB_01cd3ce0;
                }
                uVar25 = (ulong)(uint)((int)uVar28 * 4);
                uVar11 = *(undefined4 *)(local_8e0 + uVar25);
                local_a60._4_4_ = uVar11;
                local_a60._0_4_ = uVar11;
                local_a60._8_4_ = uVar11;
                local_a60._12_4_ = uVar11;
                uVar11 = *(undefined4 *)(local_8c0 + uVar25);
                local_a50._4_4_ = uVar11;
                local_a50._0_4_ = uVar11;
                local_a50._8_4_ = uVar11;
                local_a50._12_4_ = uVar11;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar25);
                local_b00.context = context->user;
                local_a30 = vpbroadcastd_avx512vl();
                uVar11 = *(undefined4 *)((long)&local_a00 + uVar25);
                local_a40._4_4_ = uVar11;
                local_a40._0_4_ = uVar11;
                local_a40._8_4_ = uVar11;
                local_a40._12_4_ = uVar11;
                uVar11 = *(undefined4 *)(local_880 + uVar25);
                local_a90._4_4_ = uVar11;
                local_a90._0_4_ = uVar11;
                local_a90._8_4_ = uVar11;
                local_a90._12_4_ = uVar11;
                uVar11 = *(undefined4 *)(local_860 + uVar25);
                local_a80._4_4_ = uVar11;
                local_a80._0_4_ = uVar11;
                local_a80._8_4_ = uVar11;
                local_a80._12_4_ = uVar11;
                uVar11 = *(undefined4 *)(local_840 + uVar25);
                local_a70._4_4_ = uVar11;
                local_a70._0_4_ = uVar11;
                local_a70._8_4_ = uVar11;
                local_a70._12_4_ = uVar11;
                vpcmpeqd_avx2(ZEXT1632(local_a30),ZEXT1632(local_a30));
                uStack_a1c = (local_b00.context)->instID[0];
                local_a20 = uStack_a1c;
                uStack_a18 = uStack_a1c;
                uStack_a14 = uStack_a1c;
                uStack_a10 = (local_b00.context)->instPrimID[0];
                uStack_a0c = uStack_a10;
                uStack_a08 = uStack_a10;
                uStack_a04 = uStack_a10;
                local_b90 = local_ad0;
                local_b00.valid = (int *)local_b90;
                local_b00.geometryUserPtr = pGVar14->userPtr;
                local_b00.hit = local_a90;
                local_b00.N = 4;
                local_ac0 = auVar69._0_32_;
                local_b00.ray = (RTCRayN *)ray;
                if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->occlusionFilterN)(&local_b00);
                  auVar69 = ZEXT3264(local_ac0);
                  auVar75 = ZEXT1664(local_b60);
                  auVar74 = ZEXT1664(local_b50);
                  auVar73 = ZEXT1664(local_b40);
                  auVar72 = ZEXT1664(local_b30);
                  auVar71 = ZEXT1664(local_b20);
                  auVar70 = ZEXT1664(local_b10);
                }
                uVar25 = vptestmd_avx512vl(local_b90,local_b90);
                if ((uVar25 & 0xf) != 0) {
                  p_Var15 = context->args->filter;
                  if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var15)(&local_b00);
                    auVar69 = ZEXT3264(local_ac0);
                    auVar75 = ZEXT1664(local_b60);
                    auVar74 = ZEXT1664(local_b50);
                    auVar73 = ZEXT1664(local_b40);
                    auVar72 = ZEXT1664(local_b30);
                    auVar71 = ZEXT1664(local_b20);
                    auVar70 = ZEXT1664(local_b10);
                  }
                  auVar35 = *(undefined1 (*) [16])(local_b00.ray + 0x80);
                  uVar25 = vptestmd_avx512vl(local_b90,local_b90);
                  uVar25 = uVar25 & 0xf;
                  auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar16 = (bool)((byte)uVar25 & 1);
                  auVar36._0_4_ = (uint)bVar16 * auVar37._0_4_ | (uint)!bVar16 * auVar35._0_4_;
                  bVar16 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar36._4_4_ = (uint)bVar16 * auVar37._4_4_ | (uint)!bVar16 * auVar35._4_4_;
                  bVar16 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar36._8_4_ = (uint)bVar16 * auVar37._8_4_ | (uint)!bVar16 * auVar35._8_4_;
                  bVar16 = SUB81(uVar25 >> 3,0);
                  auVar36._12_4_ = (uint)bVar16 * auVar37._12_4_ | (uint)!bVar16 * auVar35._12_4_;
                  *(undefined1 (*) [16])(local_b00.ray + 0x80) = auVar36;
                  if ((byte)uVar25 != 0) goto LAB_01cd3ccc;
                }
                *(int *)(ray + k * 4 + 0x80) = auVar69._0_4_;
                local_b78 = local_b78 ^ 1L << (uVar28 & 0x3f);
              }
            } while (local_b78 != 0);
          }
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }